

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O3

int cubeb_init(cubeb **context,char *context_name,char *backend_name)

{
  cubeb_ops *pcVar1;
  int iVar2;
  long lVar3;
  _func_int_cubeb_ptr_ptr_char_ptr *default_init [4];
  code *local_38 [4];
  
  if (backend_name != (char *)0x0) {
    iVar2 = strcmp(backend_name,"pulse");
    if (iVar2 == 0) {
      local_38[0] = pulse_init;
      goto LAB_00109182;
    }
    iVar2 = strcmp(backend_name,"pulse-rust");
    if ((iVar2 != 0) && (iVar2 = strcmp(backend_name,"jack"), iVar2 != 0)) {
      iVar2 = strcmp(backend_name,"alsa");
      if (iVar2 == 0) {
        local_38[0] = alsa_init;
        goto LAB_00109182;
      }
      iVar2 = strcmp(backend_name,"audiounit");
      if ((((iVar2 != 0) && (iVar2 = strcmp(backend_name,"audiounit-rust"), iVar2 != 0)) &&
          (iVar2 = strcmp(backend_name,"wasapi"), iVar2 != 0)) &&
         ((iVar2 = strcmp(backend_name,"winmm"), iVar2 != 0 &&
          (iVar2 = strcmp(backend_name,"sndio"), iVar2 == 0)))) {
        local_38[0] = sndio_init;
        goto LAB_00109182;
      }
    }
  }
  local_38[0] = (code *)0x0;
LAB_00109182:
  local_38[1] = pulse_init;
  local_38[2] = sndio_init;
  local_38[3] = alsa_init;
  if (context == (cubeb **)0x0) {
    iVar2 = -3;
  }
  else {
    lVar3 = 0;
    do {
      if ((local_38[lVar3] != (code *)0x0) &&
         (iVar2 = (*local_38[lVar3])(context,context_name), iVar2 == 0)) {
        pcVar1 = (*context)->ops;
        if (pcVar1->get_backend_id == (_func_char_ptr_cubeb_ptr *)0x0) {
          __assert_fail("(*context)->ops->get_backend_id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb.c"
                        ,0x118,"int cubeb_init(cubeb **, const char *, const char *)");
        }
        if (pcVar1->destroy == (_func_void_cubeb_ptr *)0x0) {
          __assert_fail("(*context)->ops->destroy",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb.c"
                        ,0x119,"int cubeb_init(cubeb **, const char *, const char *)");
        }
        if (pcVar1->stream_init ==
            (_func_int_cubeb_ptr_cubeb_stream_ptr_ptr_char_ptr_cubeb_devid_cubeb_stream_params_ptr_cubeb_devid_cubeb_stream_params_ptr_uint_cubeb_data_callback_cubeb_state_callback_void_ptr
             *)0x0) {
          __assert_fail("(*context)->ops->stream_init",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb.c"
                        ,0x11a,"int cubeb_init(cubeb **, const char *, const char *)");
        }
        if (pcVar1->stream_destroy != (_func_void_cubeb_stream_ptr *)0x0) {
          if (pcVar1->stream_start == (_func_int_cubeb_stream_ptr *)0x0) {
            __assert_fail("(*context)->ops->stream_start",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb.c"
                          ,0x11c,"int cubeb_init(cubeb **, const char *, const char *)");
          }
          if (pcVar1->stream_stop != (_func_int_cubeb_stream_ptr *)0x0) {
            if (pcVar1->stream_get_position != (_func_int_cubeb_stream_ptr_uint64_t_ptr *)0x0) {
              return 0;
            }
            __assert_fail("(*context)->ops->stream_get_position",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb.c"
                          ,0x11e,"int cubeb_init(cubeb **, const char *, const char *)");
          }
          __assert_fail("(*context)->ops->stream_stop",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb.c"
                        ,0x11d,"int cubeb_init(cubeb **, const char *, const char *)");
        }
        __assert_fail("(*context)->ops->stream_destroy",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb.c"
                      ,0x11b,"int cubeb_init(cubeb **, const char *, const char *)");
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
cubeb_init(cubeb ** context, char const * context_name,
           char const * backend_name)
{
  int (*init_oneshot)(cubeb **, char const *) = NULL;

  if (backend_name != NULL) {
    if (!strcmp(backend_name, "pulse")) {
#if defined(USE_PULSE)
      init_oneshot = pulse_init;
#endif
    } else if (!strcmp(backend_name, "pulse-rust")) {
#if defined(USE_PULSE_RUST)
      init_oneshot = pulse_rust_init;
#endif
    } else if (!strcmp(backend_name, "jack")) {
#if defined(USE_JACK)
      init_oneshot = jack_init;
#endif
    } else if (!strcmp(backend_name, "alsa")) {
#if defined(USE_ALSA)
      init_oneshot = alsa_init;
#endif
    } else if (!strcmp(backend_name, "audiounit")) {
#if defined(USE_AUDIOUNIT)
      init_oneshot = audiounit_init;
#endif
    } else if (!strcmp(backend_name, "audiounit-rust")) {
#if defined(USE_AUDIOUNIT_RUST)
      init_oneshot = audiounit_rust_init;
#endif
    } else if (!strcmp(backend_name, "wasapi")) {
#if defined(USE_WASAPI)
      init_oneshot = wasapi_init;
#endif
    } else if (!strcmp(backend_name, "winmm")) {
#if defined(USE_WINMM)
      init_oneshot = winmm_init;
#endif
    } else if (!strcmp(backend_name, "sndio")) {
#if defined(USE_SNDIO)
      init_oneshot = sndio_init;
#endif
    } else if (!strcmp(backend_name, "sun")) {
#if defined(USE_SUN)
      init_oneshot = sun_init;
#endif
    } else if (!strcmp(backend_name, "opensl")) {
#if defined(USE_OPENSL)
      init_oneshot = opensl_init;
#endif
    } else if (!strcmp(backend_name, "oss")) {
#if defined(USE_OSS)
      init_oneshot = oss_init;
#endif
    } else if (!strcmp(backend_name, "aaudio")) {
#if defined(USE_AAUDIO)
      init_oneshot = aaudio_init;
#endif
    } else if (!strcmp(backend_name, "audiotrack")) {
#if defined(USE_AUDIOTRACK)
      init_oneshot = audiotrack_init;
#endif
    } else if (!strcmp(backend_name, "kai")) {
#if defined(USE_KAI)
      init_oneshot = kai_init;
#endif
    } else {
      /* Already set */
    }
  }

  int (*default_init[])(cubeb **, char const *) = {
    /*
     * init_oneshot must be at the top to allow user
     * to override all other choices
     */
    init_oneshot,
#if defined(USE_PULSE_RUST)
    pulse_rust_init,
#endif
#if defined(USE_PULSE)
    pulse_init,
#endif
#if defined(USE_JACK)
    jack_init,
#endif
#if defined(USE_SNDIO)
    sndio_init,
#endif
#if defined(USE_ALSA)
    alsa_init,
#endif
#if defined(USE_OSS)
    oss_init,
#endif
#if defined(USE_AUDIOUNIT_RUST)
    audiounit_rust_init,
#endif
#if defined(USE_AUDIOUNIT)
    audiounit_init,
#endif
#if defined(USE_WASAPI)
    wasapi_init,
#endif
#if defined(USE_WINMM)
    winmm_init,
#endif
#if defined(USE_SUN)
    sun_init,
#endif
#if defined(USE_OPENSL)
    opensl_init,
#endif
  // TODO: should probably be preferred over OpenSLES when available.
  // Initialization will fail on old android devices.
#if defined(USE_AAUDIO)
    aaudio_init,
#endif
#if defined(USE_AUDIOTRACK)
    audiotrack_init,
#endif
#if defined(USE_KAI)
    kai_init,
#endif
  };
  int i;

  if (!context) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

#define OK(fn) assert((*context)->ops->fn)
  for (i = 0; i < NELEMS(default_init); ++i) {
    if (default_init[i] && default_init[i](context, context_name) == CUBEB_OK) {
      /* Assert that the minimal API is implemented. */
      OK(get_backend_id);
      OK(destroy);
      OK(stream_init);
      OK(stream_destroy);
      OK(stream_start);
      OK(stream_stop);
      OK(stream_get_position);
      return CUBEB_OK;
    }
  }
  return CUBEB_ERROR;
}